

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OneHotEncoder.pb.cc
# Opt level: O1

void __thiscall CoreML::Specification::OneHotEncoder::clear_CategoryType(OneHotEncoder *this)

{
  undefined8 *puVar1;
  ulong uVar2;
  StringVector *this_00;
  
  if (this->_oneof_case_[0] == 2) {
    uVar2 = (this->super_MessageLite)._internal_metadata_.ptr_;
    puVar1 = (undefined8 *)(uVar2 & 0xfffffffffffffffc);
    if ((uVar2 & 1) != 0) {
      puVar1 = (undefined8 *)*puVar1;
    }
    if ((puVar1 != (undefined8 *)0x0) ||
       (this_00 = (StringVector *)(this->CategoryType_).int64categories_,
       this_00 == (StringVector *)0x0)) goto LAB_002d4ef6;
    Int64Vector::~Int64Vector((Int64Vector *)this_00);
    uVar2 = 0x28;
  }
  else {
    if (this->_oneof_case_[0] != 1) goto LAB_002d4ef6;
    uVar2 = (this->super_MessageLite)._internal_metadata_.ptr_;
    puVar1 = (undefined8 *)(uVar2 & 0xfffffffffffffffc);
    if ((uVar2 & 1) != 0) {
      puVar1 = (undefined8 *)*puVar1;
    }
    if ((puVar1 != (undefined8 *)0x0) ||
       (this_00 = (this->CategoryType_).stringcategories_, this_00 == (StringVector *)0x0))
    goto LAB_002d4ef6;
    StringVector::~StringVector(this_00);
    uVar2 = 0x30;
  }
  operator_delete(this_00,uVar2);
LAB_002d4ef6:
  this->_oneof_case_[0] = 0;
  return;
}

Assistant:

void OneHotEncoder::clear_CategoryType() {
// @@protoc_insertion_point(one_of_clear_start:CoreML.Specification.OneHotEncoder)
  switch (CategoryType_case()) {
    case kStringCategories: {
      if (GetArenaForAllocation() == nullptr) {
        delete CategoryType_.stringcategories_;
      }
      break;
    }
    case kInt64Categories: {
      if (GetArenaForAllocation() == nullptr) {
        delete CategoryType_.int64categories_;
      }
      break;
    }
    case CATEGORYTYPE_NOT_SET: {
      break;
    }
  }
  _oneof_case_[0] = CATEGORYTYPE_NOT_SET;
}